

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElseExpr(BinaryReaderInterp *this)

{
  Offset fixup_offset;
  pointer pLVar1;
  Result RVar2;
  Enum EVar3;
  Offset OVar4;
  
  RVar2 = SharedValidator::OnElse
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pLVar1 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar1 == (this->label_stack_).
                  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("depth < label_stack_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x150,
                    "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                   );
    }
    fixup_offset = pLVar1[-1].fixup_offset;
    Istream::Emit(this->istream_,Br);
    OVar4 = Istream::EmitFixupU32(this->istream_);
    pLVar1[-1].fixup_offset = OVar4;
    Istream::ResolveFixupU32(this->istream_,fixup_offset);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnElseExpr() {
  CHECK_RESULT(validator_.OnElse(loc));
  Label* label = TopLabel();
  Istream::Offset fixup_cond_offset = label->fixup_offset;
  istream_.Emit(Opcode::Br);
  label->fixup_offset = istream_.EmitFixupU32();
  istream_.ResolveFixupU32(fixup_cond_offset);
  return Result::Ok;
}